

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

TextureFormat
deqp::gls::ShaderExecUtil::getRenderbufferFormatForOutput(VarType *outputType,bool useIntOutputs)

{
  int iVar1;
  DataType DVar2;
  InternalError *this;
  ulong uVar3;
  allocator<char> local_41;
  string local_40;
  
  uVar3 = 0x2100000000;
  DVar2 = (outputType->m_data).basic.type;
  iVar1 = glu::getDataTypeNumComponents(DVar2);
  DVar2 = glu::getDataTypeScalarType(DVar2);
  if (DVar2 == TYPE_FLOAT) {
    if (!useIntOutputs) {
      uVar3 = 0x2300000000;
    }
  }
  else {
    if (DVar2 != TYPE_BOOL) {
      if (DVar2 == TYPE_UINT) goto LAB_015033f5;
      if (DVar2 != TYPE_INT) {
        this = (InternalError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Invalid output type",&local_41);
        tcu::InternalError::InternalError(this,&local_40);
        __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
    }
    uVar3 = 0x1d00000000;
  }
LAB_015033f5:
  return (TextureFormat)(*(uint *)(&DAT_01907180 + (long)(iVar1 + -1) * 4) | uVar3);
}

Assistant:

static tcu::TextureFormat getRenderbufferFormatForOutput (const glu::VarType& outputType, bool useIntOutputs)
{
	const tcu::TextureFormat::ChannelOrder channelOrderMap[] =
	{
		tcu::TextureFormat::R,
		tcu::TextureFormat::RG,
		tcu::TextureFormat::RGBA,	// No RGB variants available.
		tcu::TextureFormat::RGBA
	};

	const glu::DataType					basicType		= outputType.getBasicType();
	const int							numComps		= glu::getDataTypeNumComponents(basicType);
	tcu::TextureFormat::ChannelType		channelType;

	switch (glu::getDataTypeScalarType(basicType))
	{
		case glu::TYPE_UINT:	channelType = tcu::TextureFormat::UNSIGNED_INT32;												break;
		case glu::TYPE_INT:		channelType = tcu::TextureFormat::SIGNED_INT32;													break;
		case glu::TYPE_BOOL:	channelType = tcu::TextureFormat::SIGNED_INT32;													break;
		case glu::TYPE_FLOAT:	channelType = useIntOutputs ? tcu::TextureFormat::UNSIGNED_INT32 : tcu::TextureFormat::FLOAT;	break;
		default:
			throw tcu::InternalError("Invalid output type");
	}

	DE_ASSERT(de::inRange<int>(numComps, 1, DE_LENGTH_OF_ARRAY(channelOrderMap)));

	return tcu::TextureFormat(channelOrderMap[numComps-1], channelType);
}